

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint id1;
  ulong unaff_R12;
  uint unaff_R15D;
  ulong uVar4;
  LogMessage local_1b0;
  
  uVar4 = (ulong)(uint)root;
  if ((this->inst_[root].out_opcode_ & 7) == 2) {
    bVar1 = ByteRangeEqual(this,root,id);
    uVar4 = 0;
    if (!bVar1) {
      root = 0;
    }
    unaff_R12 = (ulong)(uint)root;
  }
  else {
    do {
      iVar3 = (int)uVar4;
      if ((this->inst_[iVar3].out_opcode_ & 7) != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                   ,0x26f,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"should never happen",0x13);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        uVar4 = 0;
        unaff_R12 = 0;
        goto LAB_00121652;
      }
      bVar1 = ByteRangeEqual(this,this->inst_[iVar3].field_1.cap_,id);
      if (bVar1) {
        unaff_R15D = iVar3 * 2 + 1;
        uVar2 = 0;
        unaff_R12 = uVar4;
      }
      else {
        uVar2 = 0;
        if (this->reversed_ == true) {
          id1 = this->inst_[iVar3].out_opcode_ >> 4;
          if ((this->inst_[id1].out_opcode_ & 7) == 0) {
            uVar2 = 1;
            uVar4 = (ulong)id1;
          }
          else {
            bVar1 = ByteRangeEqual(this,id1,id);
            uVar2 = 0;
            unaff_R15D = iVar3 * 2;
            if (!bVar1) {
              unaff_R15D = uVar2;
            }
            unaff_R12 = 0;
            if (bVar1) {
              unaff_R12 = uVar4;
            }
          }
        }
        else {
          unaff_R15D = 0;
          unaff_R12 = 0;
        }
      }
    } while ((char)uVar2 != '\0');
    uVar4 = (ulong)unaff_R15D << 0x20;
  }
LAB_00121652:
  return (Frag)(unaff_R12 & 0xffffffff | uVar4);
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, nullPatchList);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1));

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1));
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}